

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O0

void runalltests_cpp_wrapper3(void)

{
  planck_unit_suite_t *ppVar1;
  planck_unit_suite_t *suite3;
  planck_unit_suite_t *suite2;
  planck_unit_suite_t *suite1;
  
  ppVar1 = cpp_wrapper3_getsuite_1();
  planck_unit_run_suite(ppVar1);
  planck_unit_destroy_suite(ppVar1);
  ppVar1 = cpp_wrapper3_getsuite_2();
  planck_unit_run_suite(ppVar1);
  planck_unit_destroy_suite(ppVar1);
  ppVar1 = cpp_wrapper3_getsuite_3();
  planck_unit_run_suite(ppVar1);
  planck_unit_destroy_suite(ppVar1);
  return;
}

Assistant:

void
runalltests_cpp_wrapper3(
) {
	fdeleteall();

	planck_unit_suite_t *suite1 = cpp_wrapper3_getsuite_1();

	planck_unit_run_suite(suite1);
	planck_unit_destroy_suite(suite1);

	planck_unit_suite_t *suite2 = cpp_wrapper3_getsuite_2();

	planck_unit_run_suite(suite2);
	planck_unit_destroy_suite(suite2);

	planck_unit_suite_t *suite3 = cpp_wrapper3_getsuite_3();

	planck_unit_run_suite(suite3);
	planck_unit_destroy_suite(suite3);
}